

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Track::Seek(Track *this,longlong time_ns,BlockEntry **pResult)

{
  Cluster **ppCVar1;
  Cluster *pCVar2;
  Cluster **ppCVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  longlong lVar7;
  BlockEntry *pBVar8;
  Cluster **ppCVar9;
  Cluster **ppCVar10;
  Cluster **ppCVar11;
  
  lVar6 = GetFirst(this,pResult);
  if (-1 < lVar6) {
    if (*pResult == (BlockEntry *)0x0) {
      __assert_fail("pResult",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x12e0,
                    "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const");
    }
    iVar5 = (*(*pResult)->_vptr_BlockEntry[3])();
    if (iVar5 != 0) {
      pCVar2 = (*pResult)->m_pCluster;
      if (pCVar2 == (Cluster *)0x0) {
        __assert_fail("pCluster",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x12e6,
                      "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const");
      }
      if (pCVar2->m_index < 0) {
        __assert_fail("pCluster->GetIndex() >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x12e7,
                      "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const");
      }
      iVar5 = (*(*pResult)->_vptr_BlockEntry[2])();
      lVar7 = Block::GetTime((Block *)CONCAT44(extraout_var,iVar5),pCVar2);
      if (lVar7 < time_ns) {
        ppCVar3 = this->m_pSegment->m_clusters;
        if (ppCVar3 == (Cluster **)0x0) {
          __assert_fail("clusters",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x12ed,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        lVar6 = this->m_pSegment->m_clusterCount;
        if (lVar6 < 1) {
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x12f0,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        lVar4 = pCVar2->m_index;
        if (ppCVar3[lVar4] != pCVar2) {
          __assert_fail("*i == pCluster",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x12f4,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        lVar7 = Cluster::GetTime(pCVar2);
        if (time_ns < lVar7) {
          __assert_fail("pCluster->GetTime() <= time_ns",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x12f5,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        ppCVar1 = ppCVar3 + lVar4;
        ppCVar9 = ppCVar1;
        ppCVar10 = ppCVar3 + lVar6;
        while (ppCVar9 < ppCVar10) {
          ppCVar11 = (Cluster **)
                     ((long)ppCVar9 +
                     (((long)ppCVar10 - (long)ppCVar9 >> 3) -
                      ((long)ppCVar10 - (long)ppCVar9 >> 0x3f) & 0xfffffffffffffffeU) * 4);
          if (ppCVar10 <= ppCVar11) {
            __assert_fail("mid < hi",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1303,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          pCVar2 = *ppCVar11;
          if (pCVar2 == (Cluster *)0x0) {
            __assert_fail("pCluster",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1306,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          if (pCVar2->m_index < 0) {
            __assert_fail("pCluster->GetIndex() >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1307,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          if (pCVar2->m_index != (long)ppCVar11 - (long)this->m_pSegment->m_clusters >> 3) {
            __assert_fail("pCluster->GetIndex() == long(mid - m_pSegment->m_clusters)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1308,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          lVar7 = Cluster::GetTime(pCVar2);
          if (lVar7 <= time_ns) {
            ppCVar9 = ppCVar11 + 1;
            ppCVar11 = ppCVar10;
          }
          ppCVar10 = ppCVar11;
          if (ppCVar11 < ppCVar9) {
            __assert_fail("lo <= hi",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x1311,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
        }
        if (ppCVar9 != ppCVar10) {
          __assert_fail("lo == hi",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1314,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        if (ppCVar9 <= ppCVar1) {
          __assert_fail("lo > i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1315,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        if (ppCVar3 + lVar6 < ppCVar9) {
          __assert_fail("lo <= j",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1316,
                        "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const")
          ;
        }
        do {
          pCVar2 = ppCVar9[-1];
          if (pCVar2 == (Cluster *)0x0) {
            __assert_fail("pCluster",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x131a,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          lVar7 = Cluster::GetTime(pCVar2);
          if (time_ns < lVar7) {
            __assert_fail("pCluster->GetTime() <= time_ns",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x131b,
                          "virtual long mkvparser::Track::Seek(long long, const BlockEntry *&) const"
                         );
          }
          pBVar8 = Cluster::GetEntry(pCVar2,this,-1);
          *pResult = pBVar8;
          if ((pBVar8 != (BlockEntry *)0x0) &&
             (iVar5 = (*pBVar8->_vptr_BlockEntry[3])(pBVar8), iVar5 != 0)) {
            return 0;
          }
          ppCVar9 = ppCVar9 + -1;
        } while (ppCVar1 < ppCVar9);
        *pResult = &(this->m_eos).super_BlockEntry;
      }
    }
    lVar6 = 0;
  }
  return lVar6;
}

Assistant:

long Track::Seek(long long time_ns, const BlockEntry*& pResult) const {
  const long status = GetFirst(pResult);

  if (status < 0)  // buffer underflow, etc
    return status;

  assert(pResult);

  if (pResult->EOS())
    return 0;

  const Cluster* pCluster = pResult->GetCluster();
  assert(pCluster);
  assert(pCluster->GetIndex() >= 0);

  if (time_ns <= pResult->GetBlock()->GetTime(pCluster))
    return 0;

  Cluster** const clusters = m_pSegment->m_clusters;
  assert(clusters);

  const long count = m_pSegment->GetCount();  // loaded only, not preloaded
  assert(count > 0);

  Cluster** const i = clusters + pCluster->GetIndex();
  assert(i);
  assert(*i == pCluster);
  assert(pCluster->GetTime() <= time_ns);

  Cluster** const j = clusters + count;

  Cluster** lo = i;
  Cluster** hi = j;

  while (lo < hi) {
    // INVARIANT:
    //[i, lo) <= time_ns
    //[lo, hi) ?
    //[hi, j)  > time_ns

    Cluster** const mid = lo + (hi - lo) / 2;
    assert(mid < hi);

    pCluster = *mid;
    assert(pCluster);
    assert(pCluster->GetIndex() >= 0);
    assert(pCluster->GetIndex() == long(mid - m_pSegment->m_clusters));

    const long long t = pCluster->GetTime();

    if (t <= time_ns)
      lo = mid + 1;
    else
      hi = mid;

    assert(lo <= hi);
  }

  assert(lo == hi);
  assert(lo > i);
  assert(lo <= j);

  while (lo > i) {
    pCluster = *--lo;
    assert(pCluster);
    assert(pCluster->GetTime() <= time_ns);

    pResult = pCluster->GetEntry(this);

    if ((pResult != 0) && !pResult->EOS())
      return 0;

    // landed on empty cluster (no entries)
  }

  pResult = GetEOS();  // weird
  return 0;
}